

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void alGetSourcefv(ALuint name,ALenum param,ALfloat *values)

{
  ulong uVar1;
  uint x;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetSourcefv);
  writele32(name);
  writele32(param);
  IO_UINT64((uint64)values);
  x = 0;
  if (param - 0x1001U < 0x26) {
    x = *(uint *)(&DAT_0010b088 + (ulong)(param - 0x1001U) * 4);
  }
  if (values == (ALfloat *)0x0) {
    x = 0;
  }
  if (x == 0) {
    (*REAL_alGetSourcefv)(name,param,values);
    writele32(0);
  }
  else {
    uVar1 = 0;
    memset(values,0,(ulong)(x * 4));
    (*REAL_alGetSourcefv)(name,param,values);
    writele32(x);
    do {
      writele32((uint32)values[uVar1]);
      uVar1 = uVar1 + 1;
    } while (x != uVar1);
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetSourcefv(ALuint name, ALenum param, ALfloat *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alGetSourcefv);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_GAIN: break;
        case AL_POSITION: numvals = 3; break;
        case AL_VELOCITY: numvals = 3; break;
        case AL_DIRECTION: numvals = 3; break;
        case AL_MIN_GAIN: break;
        case AL_MAX_GAIN: break;
        case AL_REFERENCE_DISTANCE: break;
        case AL_ROLLOFF_FACTOR: break;
        case AL_MAX_DISTANCE: break;
        case AL_PITCH: break;
        case AL_CONE_INNER_ANGLE: break;
        case AL_CONE_OUTER_ANGLE: break;
        case AL_CONE_OUTER_GAIN: break;
        case AL_SEC_OFFSET: break;
        case AL_SAMPLE_OFFSET: break;
        case AL_BYTE_OFFSET: break;
        default: numvals = 0; break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }
    if (numvals) {
        memset(values, '\0', numvals * sizeof (ALfloat));
    }

    REAL_alGetSourcefv(name, param, values);

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_FLOAT(values[i]);
    }

    IO_END();
}